

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O3

int Fra_ClausRunBmc(Clu_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int Lits [2];
  int local_38;
  lit local_34;
  
  pVVar1 = p->pAig->vCos;
  if (pVVar1->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  iVar4 = p->nFrames + p->nPref;
  if (iVar4 != 0 && SCARRY4(p->nFrames,p->nPref) == iVar4 < 0) {
    iVar4 = p->pCnf->nVars;
    pvVar2 = *pVVar1->pArray;
    iVar5 = 0;
    iVar6 = 0;
    do {
      local_38 = (p->pCnf->pVarNums[*(int *)((long)pvVar2 + 0x24)] + iVar5) * 2;
      iVar3 = sat_solver_solve(p->pSatBmc,&local_38,&local_34,(long)p->nBTLimit,0,0,0);
      if (iVar3 != -1) {
        return 0;
      }
      iVar6 = iVar6 + 1;
      iVar5 = iVar5 + iVar4;
    } while (iVar6 < p->nFrames + p->nPref);
  }
  return 1;
}

Assistant:

int Fra_ClausRunBmc( Clu_Man_t * p )
{
    Aig_Obj_t * pObj;
    int Lits[2], nLitsTot, RetValue, i;
    // set the output literals
    nLitsTot = 2 * p->pCnf->nVars;
    pObj = Aig_ManCo(p->pAig, 0);
    for ( i = 0; i < p->nPref + p->nFrames; i++ )
    {
        Lits[0] = i * nLitsTot + toLitCond( p->pCnf->pVarNums[pObj->Id], 0 ); 
        RetValue = sat_solver_solve( p->pSatBmc, Lits, Lits + 1, (ABC_INT64_T)p->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( RetValue != l_False )
            return 0;
    }
    return 1;
}